

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lex_number(LexState *ls,TValue *tv)

{
  byte *pbVar1;
  lua_State *plVar2;
  undefined2 uVar3;
  StrScanFmt SVar4;
  void *pvVar5;
  ulong uVar6;
  SBuf *pSVar7;
  undefined8 *in_RSI;
  TValue *in_RDI;
  ptrdiff_t oldtop;
  GCcdata *cd;
  lua_State *L;
  LexChar xp;
  LexChar c;
  StrScanFmt fmt;
  GCcdata *cd_2;
  GCcdata *cd_1;
  char *p;
  char *p_1;
  char *p_2;
  undefined4 in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  undefined2 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb2;
  undefined1 in_stack_fffffffffffffeb3;
  undefined1 uVar8;
  uint in_stack_fffffffffffffeb4;
  LexState *in_stack_fffffffffffffeb8;
  GCSize size;
  lua_State *in_stack_fffffffffffffec0;
  uint local_12c;
  uint local_128;
  TValue *in_stack_ffffffffffffff20;
  TValue *in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff34;
  TValue *in_stack_ffffffffffffff38;
  uint32_t uVar9;
  char *local_38;
  char *local_20;
  char *local_8;
  
  local_12c = 0x65;
  local_128 = in_RDI[6].u32.lo;
  if (local_128 == 0x30) {
    in_stack_ffffffffffffff34 = in_RDI[6].u32.lo;
    pSVar7 = (SBuf *)((long)in_RDI + 0x3c);
    in_stack_ffffffffffffff20 = in_RDI;
    in_stack_ffffffffffffff38 = in_RDI;
    uVar9 = in_stack_ffffffffffffff34;
    if (in_RDI[8].u32.lo == (pSVar7->p).ptr32) {
      local_8 = lj_buf_more2((SBuf *)CONCAT44(in_stack_fffffffffffffeb4,
                                              CONCAT13(in_stack_fffffffffffffeb3,
                                                       CONCAT12(in_stack_fffffffffffffeb2,
                                                                in_stack_fffffffffffffeb0))),
                             in_stack_fffffffffffffeac);
    }
    else {
      local_8 = (char *)(ulong)(pSVar7->p).ptr32;
    }
    *local_8 = (char)uVar9;
    (pSVar7->p).ptr32 = (int)local_8 + 1;
    in_stack_ffffffffffffff28 = in_stack_ffffffffffffff20;
    if ((char *)in_stack_ffffffffffffff20[4].u64 < (char *)in_stack_ffffffffffffff20[5].u64) {
      pbVar1 = (byte *)in_stack_ffffffffffffff20[4].u64;
      in_stack_ffffffffffffff20[4].u64 = (uint64_t)(pbVar1 + 1);
      in_stack_fffffffffffffeb4 = (uint)*pbVar1;
    }
    else {
      in_stack_fffffffffffffeb4 = lex_more(in_stack_fffffffffffffeb8);
    }
    in_stack_ffffffffffffff28[6].u32.lo = in_stack_fffffffffffffeb4;
    if ((in_stack_fffffffffffffeb4 | 0x20) == 0x78) {
      local_12c = 0x70;
    }
  }
  while( true ) {
    uVar9 = (uint32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    uVar8 = true;
    if ((((""[(long)(int)in_RDI[6].u32.lo + 1] & 0x80) == 0) &&
        (uVar8 = true, in_RDI[6].u32.lo != 0x2e)) &&
       ((in_RDI[6].u32.lo == 0x2d ||
        (in_stack_fffffffffffffeb2 = false, uVar8 = in_stack_fffffffffffffeb2,
        in_RDI[6].u32.lo == 0x2b)))) {
      in_stack_fffffffffffffeb2 = (local_128 | 0x20) == local_12c;
      uVar8 = in_stack_fffffffffffffeb2;
    }
    if ((bool)uVar8 == false) break;
    local_128 = in_RDI[6].u32.lo;
    uVar9 = in_RDI[6].fr.func.gcptr32;
    pSVar7 = (SBuf *)((long)in_RDI + 0x3c);
    if (in_RDI[8].u32.lo == (pSVar7->p).ptr32) {
      local_20 = lj_buf_more2((SBuf *)CONCAT44(in_stack_fffffffffffffeb4,
                                               CONCAT13(uVar8,CONCAT12(in_stack_fffffffffffffeb2,
                                                                       in_stack_fffffffffffffeb0))),
                              in_stack_fffffffffffffeac);
    }
    else {
      local_20 = (char *)(ulong)(pSVar7->p).ptr32;
    }
    *local_20 = (char)uVar9;
    (pSVar7->p).ptr32 = (int)local_20 + 1;
    if ((char *)in_RDI[4].u64 < (char *)in_RDI[5].u64) {
      pbVar1 = (byte *)in_RDI[4].u64;
      in_RDI[4].u64 = (uint64_t)(pbVar1 + 1);
      in_stack_fffffffffffffeac = (uint)*pbVar1;
    }
    else {
      in_stack_fffffffffffffeac = lex_more(in_stack_fffffffffffffeb8);
    }
    in_RDI[6].u32.lo = in_stack_fffffffffffffeac;
  }
  pSVar7 = (SBuf *)((long)in_RDI + 0x3c);
  if (in_RDI[8].u32.lo == (pSVar7->p).ptr32) {
    local_38 = lj_buf_more2((SBuf *)CONCAT44(in_stack_fffffffffffffeb4,
                                             (uint)CONCAT12(in_stack_fffffffffffffeb2,
                                                            in_stack_fffffffffffffeb0)),
                            in_stack_fffffffffffffeac);
  }
  else {
    local_38 = (char *)(ulong)(pSVar7->p).ptr32;
  }
  *local_38 = '\0';
  (pSVar7->p).ptr32 = (int)local_38 + 1;
  SVar4 = lj_strscan_scan((uint8_t *)&in_stack_ffffffffffffff38->u64,in_stack_ffffffffffffff34,
                          in_stack_ffffffffffffff28,uVar9);
  if (SVar4 != STRSCAN_NUM) {
    if (SVar4 == STRSCAN_ERROR) {
      lj_lex_error((LexState *)&in_RDI->field_2,0x11e,LJ_ERR_XNUMBER);
    }
    plVar2 = (lua_State *)in_RDI[1].u64;
    if (*(int *)((ulong)(plVar2->glref).ptr32 + 0x194) == 0) {
      in_stack_fffffffffffffeb8 = (LexState *)((long)plVar2->top - (ulong)(plVar2->stack).ptr32);
      luaopen_ffi(in_stack_fffffffffffffec0);
      plVar2->top = (TValue *)((long)&in_stack_fffffffffffffeb8->fs + (ulong)(plVar2->stack).ptr32);
    }
    size = (GCSize)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    if (SVar4 == STRSCAN_IMAG) {
      pvVar5 = lj_mem_newgco(in_stack_fffffffffffffec0,size);
      *(undefined1 *)((long)pvVar5 + 5) = 10;
      *(undefined2 *)((long)pvVar5 + 6) = 0x10;
      uVar6 = (ulong)(plVar2->glref).ptr32;
      *(long *)(uVar6 + 0xe0) = *(long *)(uVar6 + 0xe0) + 1;
      *(undefined8 *)((long)pvVar5 + 8) = 0;
      *(undefined8 *)((long)pvVar5 + 0x10) = *in_RSI;
    }
    else {
      uVar3 = 0xc;
      if (SVar4 == STRSCAN_I64) {
        uVar3 = 0xb;
      }
      pvVar5 = lj_mem_newgco(in_stack_fffffffffffffec0,size);
      *(undefined1 *)((long)pvVar5 + 5) = 10;
      *(undefined2 *)((long)pvVar5 + 6) = uVar3;
      uVar6 = (ulong)(plVar2->glref).ptr32;
      *(long *)(uVar6 + 0xe0) = *(long *)(uVar6 + 0xe0) + 1;
      *(undefined8 *)((long)pvVar5 + 8) = *in_RSI;
    }
    lj_parse_keepcdata(in_stack_fffffffffffffeb8,
                       (TValue *)
                       CONCAT44(in_stack_fffffffffffffeb4,
                                CONCAT13(uVar8,CONCAT12(in_stack_fffffffffffffeb2,
                                                        in_stack_fffffffffffffeb0))),
                       (GCcdata *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  return;
}

Assistant:

static void lex_number(LexState *ls, TValue *tv)
{
  StrScanFmt fmt;
  LexChar c, xp = 'e';
  lj_assertLS(lj_char_isdigit(ls->c), "bad usage");
  if ((c = ls->c) == '0' && (lex_savenext(ls) | 0x20) == 'x')
    xp = 'p';
  while (lj_char_isident(ls->c) || ls->c == '.' ||
	 ((ls->c == '-' || ls->c == '+') && (c | 0x20) == xp)) {
    c = ls->c;
    lex_savenext(ls);
  }
  lex_save(ls, '\0');
  fmt = lj_strscan_scan((const uint8_t *)sbufB(&ls->sb), sbuflen(&ls->sb)-1, tv,
	  (LJ_DUALNUM ? STRSCAN_OPT_TOINT : STRSCAN_OPT_TONUM) |
	  (LJ_HASFFI ? (STRSCAN_OPT_LL|STRSCAN_OPT_IMAG) : 0));
  if (LJ_DUALNUM && fmt == STRSCAN_INT) {
    setitype(tv, LJ_TISNUM);
  } else if (fmt == STRSCAN_NUM) {
    /* Already in correct format. */
#if LJ_HASFFI
  } else if (fmt != STRSCAN_ERROR) {
    lua_State *L = ls->L;
    GCcdata *cd;
    lj_assertLS(fmt == STRSCAN_I64 || fmt == STRSCAN_U64 || fmt == STRSCAN_IMAG,
		"unexpected number format %d", fmt);
    ctype_loadffi(L);
    if (fmt == STRSCAN_IMAG) {
      cd = lj_cdata_new_(L, CTID_COMPLEX_DOUBLE, 2*sizeof(double));
      ((double *)cdataptr(cd))[0] = 0;
      ((double *)cdataptr(cd))[1] = numV(tv);
    } else {
      cd = lj_cdata_new_(L, fmt==STRSCAN_I64 ? CTID_INT64 : CTID_UINT64, 8);
      *(uint64_t *)cdataptr(cd) = tv->u64;
    }
    lj_parse_keepcdata(ls, tv, cd);
#endif
  } else {
    lj_assertLS(fmt == STRSCAN_ERROR,
		"unexpected number format %d", fmt);
    lj_lex_error(ls, TK_number, LJ_ERR_XNUMBER);
  }
}